

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O2

bool __thiscall IR::Opnd::IsNotNumber(Opnd *this)

{
  bool bVar1;
  RegOpnd *pRVar2;
  bool bVar3;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_1a;
  
  local_1a = (this->m_valueType).field_0;
  bVar1 = ValueType::IsNotNumber((ValueType *)&local_1a.field_0);
  bVar3 = true;
  if (!bVar1) {
    if (this->m_kind == OpndKindReg) {
      pRVar2 = AsRegOpnd(this);
      if (pRVar2->m_sym != (StackSym *)0x0) {
        bVar3 = (bool)((pRVar2->m_sym->field_0x18 & 2) >> 1);
      }
    }
    else {
      bVar3 = false;
    }
  }
  return bVar3;
}

Assistant:

bool
Opnd::IsNotNumber() const
{
    if (this->GetValueType().IsNotNumber())
    {
        return true;
    }
    if (this->IsRegOpnd())
    {
        const IR::RegOpnd* regOpnd = this->AsRegOpnd();

        if (regOpnd->m_sym == nullptr)
        {
            return true;
        }

        return regOpnd->m_sym->m_isNotNumber;
    }
    return false;
}